

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_reply.c
# Opt level: O1

tnt_reply * tnt_reply_init(tnt_reply *r)

{
  bool bVar1;
  
  bVar1 = r == (tnt_reply *)0x0;
  if ((bVar1) && (r = (tnt_reply *)tnt_mem_alloc(0x78), r == (tnt_reply *)0x0)) {
    return (tnt_reply *)0x0;
  }
  *(undefined8 *)r = 0;
  r->bitmap = 0;
  r->metadata_end = (char *)0x0;
  r->sqlinfo = (char *)0x0;
  r->data_end = (char *)0x0;
  r->metadata = (char *)0x0;
  r->error_end = (char *)0x0;
  r->data = (char *)0x0;
  r->schema_id = 0;
  r->error = (char *)0x0;
  r->code = 0;
  r->sync = 0;
  r->buf = (char *)0x0;
  r->buf_size = 0;
  r->sqlinfo_end = (char *)0x0;
  r->alloc = (uint)bVar1;
  return r;
}

Assistant:

struct tnt_reply *tnt_reply_init(struct tnt_reply *r) {
	int alloc = (r == NULL);
	if (alloc) {
		r = tnt_mem_alloc(sizeof(struct tnt_reply));
		if (!r) return NULL;
	}
	memset(r, 0, sizeof(struct tnt_reply));
	r->alloc = alloc;
	return r;
}